

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O0

int do_othername(GENERAL_NAME *gen,char *value,X509V3_CTX *ctx)

{
  char *pcVar1;
  OTHERNAME *a;
  char *s;
  ASN1_OBJECT *pAVar2;
  ASN1_TYPE *pAVar3;
  char *objtmp;
  OTHERNAME *name;
  char *semicolon;
  X509V3_CTX *ctx_local;
  char *value_local;
  GENERAL_NAME *gen_local;
  
  pcVar1 = strchr(value,0x3b);
  if ((pcVar1 != (char *)0x0) && (a = OTHERNAME_new(), a != (OTHERNAME *)0x0)) {
    s = OPENSSL_strndup(value,(long)pcVar1 - (long)value);
    if (s != (char *)0x0) {
      ASN1_OBJECT_free(a->type_id);
      pAVar2 = OBJ_txt2obj(s,0);
      a->type_id = pAVar2;
      OPENSSL_free(s);
      if (a->type_id != (ASN1_OBJECT *)0x0) {
        ASN1_TYPE_free(a->value);
        pAVar3 = ASN1_generate_v3(pcVar1 + 1,(X509V3_CTX *)ctx);
        a->value = pAVar3;
        if (a->value != (ASN1_TYPE *)0x0) {
          gen->type = 0;
          (gen->d).otherName = (OTHERNAME *)a;
          return 1;
        }
      }
    }
    OTHERNAME_free(a);
  }
  return 0;
}

Assistant:

static int do_othername(GENERAL_NAME *gen, const char *value,
                        const X509V3_CTX *ctx) {
  const char *semicolon = strchr(value, ';');
  if (semicolon == NULL) {
    return 0;
  }

  OTHERNAME *name = OTHERNAME_new();
  if (name == NULL) {
    return 0;
  }

  char *objtmp = OPENSSL_strndup(value, semicolon - value);
  if (objtmp == NULL) {
    goto err;
  }
  ASN1_OBJECT_free(name->type_id);
  name->type_id = OBJ_txt2obj(objtmp, /*dont_search_names=*/0);
  OPENSSL_free(objtmp);
  if (name->type_id == NULL) {
    goto err;
  }

  ASN1_TYPE_free(name->value);
  name->value = ASN1_generate_v3(semicolon + 1, ctx);
  if (name->value == NULL) {
    goto err;
  }

  gen->type = GEN_OTHERNAME;
  gen->d.otherName = name;
  return 1;

err:
  OTHERNAME_free(name);
  return 0;
}